

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O0

void __thiscall r_exec::ICST::~ICST(ICST *this)

{
  ICST *this_local;
  
  ~ICST(this);
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT ICST:
    public LObject
{
public:
    ICST();
    ICST(r_code::SysObject *source);

    bool is_invalidated();

    bool contains(_Fact *component, uint16_t &component_index) const;

    P<BindingMap> bindings;
    std::vector<P<_Fact> > components; // the inputs that triggered the building of the icst.
}